

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O0

void sq_newtableex(HSQUIRRELVM v,SQInteger initialcapacity)

{
  SQTable *x;
  SQSharedState *in_RDI;
  SQObjectPtr *in_stack_ffffffffffffffb8;
  SQObjectPtr local_20 [2];
  
  x = SQTable::Create(in_RDI,(SQInteger)in_stack_ffffffffffffffb8);
  SQObjectPtr::SQObjectPtr(local_20,x);
  SQVM::Push((SQVM *)in_RDI,in_stack_ffffffffffffffb8);
  SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_RDI);
  return;
}

Assistant:

void sq_newtableex(HSQUIRRELVM v,SQInteger initialcapacity)
{
    v->Push(SQTable::Create(_ss(v), initialcapacity));
}